

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaemonClient.cpp
# Opt level: O2

bool __thiscall xmrig::DaemonClient::parseJob(DaemonClient *this,Value *params,int *code)

{
  Job *this_00;
  IClientListener *pIVar1;
  bool bVar2;
  type tVar3;
  char *pcVar4;
  uint64_t diff;
  EVP_PKEY_CTX *dst;
  long lVar5;
  EVP_PKEY_CTX *src;
  uint uVar6;
  String blocktemplate;
  vector<unsigned_char,_std::allocator<unsigned_char>_> b;
  uint64_t t_stamp;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_138;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_130;
  Job job;
  
  String::String((String *)&b,"");
  Job::Job(&job,(String *)&b);
  String::~String((String *)&b);
  pcVar4 = Json::getString(params,"blocktemplate_blob",(char *)0x0);
  String::String(&blocktemplate,pcVar4);
  if (blocktemplate.m_data != (char *)0x0) {
    pcVar4 = Json::getString(params,"blockhashing_blob",(char *)0x0);
    bVar2 = Job::setBlob(&job,pcVar4);
    if (bVar2) {
      job.m_height = Json::getUint64(params,"height",0);
      diff = Json::getUint64(params,"difficulty",0);
      Job::setDiff(&job,diff);
      Job::setId(&job,blocktemplate.m_data + (blocktemplate.m_size - 0x20));
      this_00 = &(this->super_BaseClient).m_job;
      Job::operator=(this_00,&job);
      String::operator=(&this->m_blocktemplate,&blocktemplate);
      dst = (EVP_PKEY_CTX *)Json::getString(params,"prev_hash",(char *)0x0);
      String::copy(&this->m_prevHash,dst,src);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&b,
                 (this->super_BaseClient).m_job.m_blob + 2,
                 (this->super_BaseClient).m_job.m_blob + ((this->super_BaseClient).m_job.m_size - 2)
                 ,(allocator_type *)&t_stamp);
      t_stamp = 0;
      local_130._M_current =
           b.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_138._M_current =
           b.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
      tVar3 = std::enable_if<((std::is_integral<unsigned_long>::value&&std::
              is_unsigned<unsigned_long>::value)&&((0)<=(64)))&&((64)<=std::
              numeric_limits<unsigned_long>::digits),int>::type_tools::read_varint<64,__gnu_cxx::
              __normal_iterator<unsigned_char*,std::vector<unsigned_char,std::
              allocator<unsigned_char>>>_unsigned_long>(&local_130,&local_138,&t_stamp);
      lVar5 = (long)tVar3;
      uVar6 = (uint)b.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar5 + 1] << 8 |
              (uint)b.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar5] << 0x10 |
              (uint)b.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar5 + 2];
      (this->super_BaseClient).m_job.m_extraIters =
           (ulong)((int)(t_stamp % (ulong)(uVar6 + (uVar6 == 0))) + (int)job.m_height & 0x7fff);
      if ((this->super_BaseClient).m_state == ConnectingState) {
        setState(this,ConnectedState);
      }
      pIVar1 = (this->super_BaseClient).m_listener;
      (*pIVar1->_vptr_IClientListener[3])(pIVar1,this,this_00,params);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&b.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      bVar2 = true;
      goto LAB_0016225f;
    }
  }
  *code = 4;
  bVar2 = false;
LAB_0016225f:
  String::~String(&blocktemplate);
  Job::~Job(&job);
  return bVar2;
}

Assistant:

bool xmrig::DaemonClient::parseJob(const rapidjson::Value &params, int *code)
{
    Job job("");

    String blocktemplate = Json::getString(params, kBlocktemplateBlob);
    if (blocktemplate.isNull() || !job.setBlob(Json::getString(params, "blockhashing_blob"))) {
        *code = 4;
        return false;
    }

    job.setHeight(Json::getUint64(params, kHeight));
    job.setDiff(Json::getUint64(params, "difficulty"));
    job.setId(blocktemplate.data() + blocktemplate.size() - 32);

    m_job           = std::move(job);
    m_blocktemplate = std::move(blocktemplate);
    m_prevHash      = Json::getString(params, "prev_hash");

    const uint8_t* blob = m_job.blob();
    size_t blob_size = m_job.size();

    std::vector<uint8_t> b(blob + 2, blob + (blob_size - 2));
    uint64_t t_stamp = 0;
    int read = tools::read_varint(b.begin(), b.end(), t_stamp);

    uint8_t id_num_bytes[4] = {0};
    id_num_bytes[2] = b[read++];
    id_num_bytes[1] = b[read++];
    id_num_bytes[0] = b[read++];

    uint32_t id_num = *((uint32_t*)id_num_bytes);

    if (id_num < 1)
        id_num = 1;

    uint64_t extra_iters = ((t_stamp % id_num) + job.height()) & 0x7FFF;

    m_job.setExtraIters(extra_iters);

    if (m_state == ConnectingState) {
        setState(ConnectedState);
    }

    m_listener->onJobReceived(this, m_job, params);
    return true;
}